

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfHeaderM44fAttribute(ImfHeader *hdr,char *name,float (*m) [4])

{
  TypedAttribute<Imath_3_2::Matrix44<float>_> *this;
  Matrix44<float> *this_00;
  float *pfVar1;
  Header *in_RDX;
  ImfHeader *in_RDI;
  exception *e;
  M44f *m4;
  char *in_stack_ffffffffffffffd8;
  
  anon_unknown.dwarf_70604::header(in_RDI);
  this = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>>
                   (in_RDX,in_stack_ffffffffffffffd8);
  this_00 = Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>_>::value(this);
  pfVar1 = Imath_3_2::Matrix44<float>::operator[](this_00,0);
  *(float *)&(in_RDX->_map)._M_t._M_impl = *pfVar1;
  pfVar1 = Imath_3_2::Matrix44<float>::operator[](this_00,0);
  *(float *)&(in_RDX->_map)._M_t._M_impl.field_0x4 = pfVar1[1];
  pfVar1 = Imath_3_2::Matrix44<float>::operator[](this_00,0);
  (in_RDX->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)pfVar1[2];
  pfVar1 = Imath_3_2::Matrix44<float>::operator[](this_00,0);
  *(float *)&(in_RDX->_map)._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 = pfVar1[3];
  pfVar1 = Imath_3_2::Matrix44<float>::operator[](this_00,1);
  *(float *)&(in_RDX->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = *pfVar1;
  pfVar1 = Imath_3_2::Matrix44<float>::operator[](this_00,1);
  *(float *)((long)&(in_RDX->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + 4) =
       pfVar1[1];
  pfVar1 = Imath_3_2::Matrix44<float>::operator[](this_00,1);
  *(float *)&(in_RDX->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = pfVar1[2];
  pfVar1 = Imath_3_2::Matrix44<float>::operator[](this_00,1);
  *(float *)((long)&(in_RDX->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 4) =
       pfVar1[3];
  pfVar1 = Imath_3_2::Matrix44<float>::operator[](this_00,2);
  *(float *)&(in_RDX->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = *pfVar1;
  pfVar1 = Imath_3_2::Matrix44<float>::operator[](this_00,2);
  *(float *)((long)&(in_RDX->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right + 4) =
       pfVar1[1];
  pfVar1 = Imath_3_2::Matrix44<float>::operator[](this_00,2);
  *(float *)&(in_RDX->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = pfVar1[2];
  pfVar1 = Imath_3_2::Matrix44<float>::operator[](this_00,2);
  *(float *)((long)&(in_RDX->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count + 4) = pfVar1[3]
  ;
  pfVar1 = Imath_3_2::Matrix44<float>::operator[](this_00,3);
  *(float *)&in_RDX->_readsNothing = *pfVar1;
  pfVar1 = Imath_3_2::Matrix44<float>::operator[](this_00,3);
  *(float *)&in_RDX->field_0x34 = pfVar1[1];
  pfVar1 = Imath_3_2::Matrix44<float>::operator[](this_00,3);
  *(float *)&in_RDX[1]._map._M_t._M_impl = pfVar1[2];
  pfVar1 = Imath_3_2::Matrix44<float>::operator[](this_00,3);
  *(float *)&in_RDX[1]._map._M_t._M_impl.field_0x4 = pfVar1[3];
  return 1;
}

Assistant:

int
ImfHeaderM44fAttribute (const ImfHeader* hdr, const char name[], float m[4][4])
{
    try
    {
        const M44f& m4 =
            header (hdr)
                ->typedAttribute<
                    OPENEXR_IMF_INTERNAL_NAMESPACE::M44fAttribute> (name)
                .value ();

        m[0][0] = m4[0][0];
        m[0][1] = m4[0][1];
        m[0][2] = m4[0][2];
        m[0][3] = m4[0][3];

        m[1][0] = m4[1][0];
        m[1][1] = m4[1][1];
        m[1][2] = m4[1][2];
        m[1][3] = m4[1][3];

        m[2][0] = m4[2][0];
        m[2][1] = m4[2][1];
        m[2][2] = m4[2][2];
        m[2][3] = m4[2][3];

        m[3][0] = m4[3][0];
        m[3][1] = m4[3][1];
        m[3][2] = m4[3][2];
        m[3][3] = m4[3][3];

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}